

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O0

bool ParseFilename(Value *val,string *result)

{
  bool bVar1;
  String local_40;
  string *local_20;
  string *result_local;
  Value *val_local;
  
  local_20 = result;
  result_local = (string *)val;
  bVar1 = Json::Value::isString(val);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_40,(Value *)result_local);
    std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

static bool ParseFilename(Json::Value const& val, std::string& result)
{
  if (val.isString()) {
    result = val.asString();
  } else {
    return false;
  }

  return true;
}